

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

lys_module * lys_parse_path(ly_ctx *ctx,char *path,LYS_INFORMAT format)

{
  int iVar1;
  LY_ERR *pLVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  lys_revision *local_68;
  size_t len;
  char *filename;
  char *dot;
  char *rev;
  lys_module *ret;
  int fd;
  LYS_INFORMAT format_local;
  char *path_local;
  ly_ctx *ctx_local;
  
  if ((ctx == (ly_ctx *)0x0) || (path == (char *)0x0)) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    ly_log(LY_LLERR,"%s: Invalid parameter.","lys_parse_path");
    ctx_local = (ly_ctx *)0x0;
  }
  else {
    iVar1 = open(path,0);
    if (iVar1 == -1) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_ESYS;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      ly_log(LY_LLERR,"Opening file \"%s\" failed (%s).",path,pcVar4);
      ctx_local = (ly_ctx *)0x0;
    }
    else {
      ctx_local = (ly_ctx *)lys_parse_fd(ctx,iVar1,format);
      close(iVar1);
      if (ctx_local == (ly_ctx *)0x0) {
        ctx_local = (ly_ctx *)0x0;
      }
      else {
        pcVar4 = strrchr(path,0x2f);
        len = (size_t)path;
        if (pcVar4 != (char *)0x0) {
          len = (size_t)(pcVar4 + 1);
        }
        pcVar4 = strchr((char *)len,0x40);
        pcVar5 = strrchr((char *)len,0x2e);
        __n = strlen((ctx_local->dict).recs[0].value);
        iVar1 = strncmp((char *)len,(ctx_local->dict).recs[0].value,__n);
        if ((((iVar1 != 0) || ((pcVar4 != (char *)0x0 && (pcVar4 != (char *)(len + __n))))) ||
            ((pcVar4 == (char *)0x0 && (pcVar5 != (char *)(len + __n))))) && ('\0' < ly_log_level))
        {
          ly_log(LY_LLWRN,"File name \"%s\" does not match module name \"%s\".",len,
                 (ctx_local->dict).recs[0].value);
        }
        if (pcVar4 != (char *)0x0) {
          if (((((ctx_local->dict).recs[2].field_0x11 == '\0') ||
               ((long)pcVar5 - (long)(pcVar4 + 1) != 10)) ||
              (iVar1 = strncmp((char *)(ctx_local->dict).recs[3].value,pcVar4 + 1,10), iVar1 != 0))
             && ('\0' < ly_log_level)) {
            if ((ctx_local->dict).recs[2].field_0x11 == '\0') {
              local_68 = (lys_revision *)0x1c884b;
            }
            else {
              local_68 = (lys_revision *)(ctx_local->dict).recs[3].value;
            }
            ly_log(LY_LLWRN,"File name \"%s\" does not match module revision \"%s\".",len,local_68);
          }
        }
        if ((ctx_local->dict).recs[2].value == (char *)0x0) {
          pcVar4 = lydict_insert(ctx,path,0);
          (ctx_local->dict).recs[2].value = pcVar4;
        }
      }
    }
  }
  return (lys_module *)ctx_local;
}

Assistant:

lys_module *
lys_parse_path(struct ly_ctx *ctx, const char *path, LYS_INFORMAT format)
{
    int fd;
    const struct lys_module *ret;
    const char *rev, *dot, *filename;
    size_t len;

    if (!ctx || !path) {
        LOGERR(LY_EINVAL, "%s: Invalid parameter.", __func__);
        return NULL;
    }

    fd = open(path, O_RDONLY);
    if (fd == -1) {
        LOGERR(LY_ESYS, "Opening file \"%s\" failed (%s).", path, strerror(errno));
        return NULL;
    }

    ret = lys_parse_fd(ctx, fd, format);
    close(fd);

    if (!ret) {
        /* error */
        return NULL;
    }

    /* check that name and revision match filename */
    filename = strrchr(path, '/');
    if (!filename) {
        filename = path;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    dot = strrchr(filename, '.');

    /* name */
    len = strlen(ret->name);
    if (strncmp(filename, ret->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN("File name \"%s\" does not match module name \"%s\".", filename, ret->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!ret->rev_size || len != 10 || strncmp(ret->rev[0].date, rev, len)) {
            LOGWRN("File name \"%s\" does not match module revision \"%s\".", filename,
                   ret->rev_size ? ret->rev[0].date : "none");
        }
    }

    if (!ret->filepath) {
        /* store URI */
        ((struct lys_module *)ret)->filepath = lydict_insert(ctx, path, 0);
    }

    return ret;
}